

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void object_suite::fail_empty_mismatched(void)

{
  error_code eVar1;
  undefined4 local_1bc;
  int local_1b8 [2];
  error_category *local_1b0;
  undefined4 local_1a0;
  value local_19c;
  undefined1 local_197;
  undefined1 local_196 [2];
  undefined4 local_194;
  size_type local_190 [3];
  undefined4 local_174;
  value local_170 [2];
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_158 [8];
  reader reader;
  char input [3];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 0x5d7b;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,
             (char *)((long)&reader.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_158,&local_168);
  local_170[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_174 = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x382,"void object_suite::fail_empty_mismatched()",local_170,&local_174);
  local_190[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_158);
  local_194 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,899,"void object_suite::fail_empty_mismatched()",local_190,&local_194);
  local_196[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_197 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,900,"void object_suite::fail_empty_mismatched()",local_196,&local_197);
  local_19c = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_1a0 = 0xfffffff8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_expected_end_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x385,"void object_suite::fail_empty_mismatched()",&local_19c,&local_1a0);
  eVar1 = trial::protocol::json::basic_reader<char>::error((basic_reader<char> *)local_158);
  local_1b0 = eVar1._M_cat;
  local_1b8[0] = eVar1._M_value;
  local_1bc = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::error_code,trial::protocol::json::errc>
            ("reader.error()","json::expected_end_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x386,"void object_suite::fail_empty_mismatched()",local_1b8,&local_1bc);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_158);
  return;
}

Assistant:

void fail_empty_mismatched()
{
    const char input[] = "{]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_expected_end_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.error(), json::expected_end_object);
}